

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_digests.c
# Opt level: O2

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests,char *value,size_t len)

{
  char *pcVar1;
  st_h2o_mem_pool_chunk_t *psVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *target_00;
  h2o_mem_pool_t *phVar10;
  ulong uVar11;
  char *target;
  long lVar12;
  h2o_mem_pool_t *pool;
  int iVar13;
  h2o_iovec_t hVar14;
  st_h2o_mem_pool_chunk_t *local_d8;
  size_t token_len;
  st_golombset_decode_t ctx;
  h2o_mem_pool_t local_a8;
  ulong local_88;
  uint64_t local_80;
  ulong local_78;
  uint64_t local_70;
  size_t gcs_base64_len;
  uint64_t pbits;
  uint64_t nbits;
  h2o_iovec_t token_value;
  h2o_iovec_t iter;
  
  iter.base = value;
  iter.len = len;
  do {
    pcVar9 = h2o_next_token(&iter,0x3b,&gcs_base64_len,(h2o_iovec_t *)0x0);
    if (pcVar9 == (char *)0x0) {
      return;
    }
    bVar5 = true;
    iVar13 = 0;
    bVar4 = false;
    bVar7 = false;
    while ((bVar6 = bVar7, target_00 = h2o_next_token(&iter,0x3b,&token_len,&token_value),
           target_00 != (char *)0x0 && ((token_len != 1 || (*target_00 != ','))))) {
      iVar8 = h2o_lcstris(target_00,token_len,"reset",5);
      if (iVar8 == 0) {
        iVar8 = h2o_lcstris(target_00,token_len,"validators",10);
        bVar7 = true;
        if (iVar8 == 0) {
          iVar8 = h2o_lcstris(target_00,token_len,"complete",8);
          if (iVar8 == 0) {
            bVar4 = true;
            bVar7 = bVar6;
          }
          else {
            iVar13 = 1;
            bVar7 = bVar6;
          }
        }
      }
      else {
        bVar5 = false;
        bVar7 = bVar6;
      }
    }
    if ((!bVar5) && (*digests != (h2o_cache_digests_t *)0x0)) {
      h2o_cache_digests_destroy(*digests);
      *digests = (h2o_cache_digests_t *)0x0;
    }
    if (!bVar4) {
      local_a8.shared_refs = (st_h2o_mem_pool_shared_ref_t *)0x0;
      local_a8.directs = (st_h2o_mem_pool_direct_t *)0x0;
      local_a8.chunks = (st_h2o_mem_pool_chunk_t *)0x0;
      local_a8.chunk_offset = 0;
      ctx.src = (uchar *)0x0;
      ctx.src_max = (uchar *)0x0;
      ctx.src_shift = 0;
      ctx._20_4_ = 0;
      hVar14 = h2o_decode_base64url((h2o_mem_pool_t *)0x0,pcVar9,gcs_base64_len);
      pcVar9 = hVar14.base;
      local_d8 = (st_h2o_mem_pool_chunk_t *)0x0;
      if (pcVar9 != (char *)0x0) {
        ctx.src = (uchar *)(pcVar9 + -1);
        ctx.src_max = (uchar *)(pcVar9 + hVar14.len);
        ctx._16_8_ = ctx._16_8_ & 0xffffffff00000000;
        iVar8 = golombset_decode_bits(&ctx,5,&nbits);
        if ((iVar8 == 0) && (iVar8 = golombset_decode_bits(&ctx,5,&pbits), iVar8 == 0)) {
          local_a8.directs =
               (st_h2o_mem_pool_direct_t *)CONCAT44(local_a8.directs._4_4_,(int)nbits + (int)pbits);
          local_70 = pbits;
          local_78 = pbits & 0xffffffff;
          local_d8 = (st_h2o_mem_pool_chunk_t *)0x0;
          local_88 = 0xffffffffffffffff;
          while( true ) {
            lVar12 = 0;
            while (iVar8 = golombset_decode_bit(&ctx), iVar8 == 0) {
              lVar12 = lVar12 + 1;
            }
            if ((iVar8 == -1) ||
               (iVar8 = golombset_decode_bits(&ctx,(uint)local_70,&local_80), iVar8 == -1)) {
              phVar10 = (h2o_mem_pool_t *)*digests;
              if (phVar10 == (h2o_mem_pool_t *)0x0) {
                phVar10 = (h2o_mem_pool_t *)calloc(1,0x38);
                if (phVar10 == (h2o_mem_pool_t *)0x0) {
                  h2o__fatal(
                            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                            );
                }
                *digests = (h2o_cache_digests_t *)phVar10;
              }
              pool = (h2o_mem_pool_t *)&phVar10->directs;
              if (!bVar6) {
                pool = phVar10;
              }
              h2o_vector__reserve(pool,(h2o_vector_t *)0x20,pool->chunk_offset + 1,(size_t)digests);
              psVar2 = pool->chunks;
              sVar3 = pool->chunk_offset;
              pool->chunk_offset = sVar3 + 1;
              lVar12 = sVar3 * 0x20;
              pcVar1 = psVar2->bytes + lVar12;
              *(st_h2o_mem_pool_shared_ref_t **)pcVar1 = local_a8.shared_refs;
              *(st_h2o_mem_pool_direct_t **)(pcVar1 + 8) = local_a8.directs;
              pcVar1 = psVar2->bytes + lVar12 + -0x10;
              *(st_h2o_mem_pool_chunk_t **)pcVar1 = local_a8.chunks;
              *(size_t *)(pcVar1 + 8) = local_a8.chunk_offset;
              local_a8.chunks = (st_h2o_mem_pool_chunk_t *)0x0;
              local_a8.chunk_offset = 0;
              local_a8.shared_refs = (st_h2o_mem_pool_shared_ref_t *)0x0;
              local_a8.directs = (st_h2o_mem_pool_direct_t *)0x0;
              ((*digests)->fresh).complete = iVar13;
              goto LAB_0014ad99;
            }
            local_80 = (lVar12 << ((byte)local_78 & 0x3f)) + local_80;
            uVar11 = local_88 + local_80 + 1;
            if (uVar11 >> ((byte)local_a8.directs & 0x3f) != 0) break;
            h2o_vector__reserve(&local_a8,(h2o_vector_t *)0x8,local_a8.chunk_offset + 1,
                                CONCAT71((int7)(local_78 >> 8),(byte)local_a8.directs));
            local_d8 = local_a8.chunks;
            *(ulong *)((local_a8.chunks)->bytes + local_a8.chunk_offset * 8 + -0x10) = uVar11;
            local_a8.chunk_offset = local_a8.chunk_offset + 1;
            local_88 = uVar11;
          }
        }
        else {
LAB_0014ad99:
          local_d8 = (st_h2o_mem_pool_chunk_t *)0x0;
        }
      }
      free(local_d8);
      free(pcVar9);
    }
    if (target_00 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests, const char *value, size_t len)
{
    h2o_iovec_t iter = h2o_iovec_init(value, len);
    const char *token;
    size_t token_len;

    do {
        const char *gcs_base64;
        size_t gcs_base64_len;
        int reset = 0, validators = 0, complete = 0, skip = 0;
        h2o_iovec_t token_value;

        if ((gcs_base64 = h2o_next_token(&iter, ';', &gcs_base64_len, NULL)) == NULL)
            return;
        while ((token = h2o_next_token(&iter, ';', &token_len, &token_value)) != NULL &&
               !h2o_memis(token, token_len, H2O_STRLIT(","))) {
            if (h2o_lcstris(token, token_len, H2O_STRLIT("reset"))) {
                reset = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("validators"))) {
                validators = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("complete"))) {
                complete = 1;
            } else {
                skip = 1;
            }
        }

        if (reset && *digests != NULL) {
            h2o_cache_digests_destroy(*digests);
            *digests = NULL;
        }

        if (skip) {
            /* not supported for the time being */
        } else {
            load_digest(digests, gcs_base64, gcs_base64_len, validators, complete);
        }
    } while (token != NULL);
}